

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O2

CURLUcode parseurl_and_replace(char *url,CURLU *u,uint flags)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  _Bool _Var4;
  CURLUcode CVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  CURLcode CVar9;
  size_t sVar10;
  Curl_handler *pCVar11;
  size_t authlen;
  byte *pbVar12;
  void *pvVar13;
  char *pcVar14;
  long lVar15;
  size_t buflen;
  uint uVar16;
  char cVar17;
  byte *pbVar18;
  CURLU *pCVar19;
  byte *pbVar20;
  char *pcVar21;
  byte *pbVar22;
  ulong uVar23;
  byte bVar24;
  byte *local_140;
  size_t blen;
  char *p;
  Curl_URL *local_128;
  byte *local_120;
  size_t urllen;
  byte *local_110;
  dynbuf enc;
  CURLU tmpurl;
  dynbuf host;
  char schemebuf [41];
  
  bVar24 = 0;
  tmpurl.query = (char *)0x0;
  tmpurl.fragment = (char *)0x0;
  tmpurl.port = (char *)0x0;
  tmpurl.path = (char *)0x0;
  tmpurl.host = (char *)0x0;
  tmpurl.zoneid = (char *)0x0;
  tmpurl.password = (char *)0x0;
  tmpurl.options = (char *)0x0;
  tmpurl.scheme = (char *)0x0;
  tmpurl.user = (char *)0x0;
  tmpurl.portnum = 0;
  tmpurl._82_6_ = 0;
  Curl_dyn_init(&host,8000000);
  CVar5 = Curl_junkscan(url,&urllen,(_Bool)((byte)(flags >> 0xb) & 1));
  if (CVar5 != CURLUE_OK) goto LAB_00162168;
  sVar10 = Curl_is_absolute_url(url,schemebuf,buflen,(flags & 0x204) != 0);
  cVar17 = (char)flags;
  if (sVar10 == 0) {
    if ((flags & 0x204) == 0) {
      CVar5 = CURLUE_BAD_SCHEME;
      goto LAB_00162168;
    }
    pcVar14 = url;
    if ((flags & 4) != 0) {
      pcVar21 = "https";
      local_128 = u;
      goto LAB_00161bb4;
    }
    bVar3 = false;
    local_128 = u;
LAB_00161bd0:
    authlen = strcspn(pcVar14,"/?#");
    local_140 = (byte *)(pcVar14 + authlen);
    pbVar22 = (byte *)(url + (urllen - (long)local_140));
    if (authlen != 0) {
      CVar5 = parse_authority(&tmpurl,pcVar14,authlen,flags,&host,sVar10 != 0);
      if (CVar5 != CURLUE_OK) goto LAB_00162168;
      u = local_128;
      if ((flags >> 9 & 1) != 0 && !bVar3) {
        pcVar14 = Curl_dyn_ptr(&host);
        iVar6 = curl_strnequal(pcVar14,"ftp.",4);
        u = local_128;
        if (iVar6 == 0) {
          iVar6 = curl_strnequal(pcVar14,"dict.",5);
          if (iVar6 == 0) {
            iVar6 = curl_strnequal(pcVar14,"ldap.",5);
            if (iVar6 == 0) {
              iVar6 = curl_strnequal(pcVar14,"imap.",5);
              if (iVar6 == 0) {
                iVar6 = curl_strnequal(pcVar14,"smtp.",5);
                if (iVar6 == 0) {
                  iVar6 = curl_strnequal(pcVar14,"pop3.",5);
                  pcVar14 = "pop3";
                  if (iVar6 == 0) {
                    pcVar14 = "http";
                  }
                }
                else {
                  pcVar14 = "smtp";
                }
              }
              else {
                pcVar14 = "imap";
              }
            }
            else {
              pcVar14 = "ldap";
            }
          }
          else {
            pcVar14 = "dict";
          }
        }
        else {
          pcVar14 = "ftp";
        }
        tmpurl.scheme = (*Curl_cstrdup)(pcVar14);
        if (tmpurl.scheme == (char *)0x0) goto LAB_00162164;
        tmpurl._80_8_ = tmpurl._80_8_ | 0x40000;
      }
      goto LAB_00161dbe;
    }
    if ((flags >> 10 & 1) == 0) {
      CVar5 = CURLUE_NO_HOST;
      goto LAB_00162168;
    }
    CVar9 = Curl_dyn_add(&host,"");
    u = local_128;
    if (CVar9 == CURLE_OK) goto LAB_00161dbe;
LAB_00162164:
    CVar5 = CURLUE_OUT_OF_MEMORY;
    goto LAB_00162168;
  }
  iVar6 = bcmp(schemebuf,"file",5);
  if (iVar6 != 0) {
    pcVar14 = url + sVar10;
    uVar7 = 0xfffffffe;
    do {
      pcVar21 = pcVar14 + 1;
      pcVar14 = pcVar14 + 1;
      uVar16 = uVar7 + 1;
      if (*pcVar21 != '/') break;
      uVar8 = uVar7 + 2;
      uVar7 = uVar16;
    } while (uVar8 < 4);
    pcVar21 = schemebuf;
    local_128 = u;
    pCVar11 = Curl_get_scheme_handler(pcVar21);
    if ((flags & 8) == 0 && pCVar11 == (Curl_handler *)0x0) {
      CVar5 = CURLUE_UNSUPPORTED_SCHEME;
      goto LAB_00162168;
    }
    if (2 < uVar16) {
      CVar5 = CURLUE_BAD_SLASHES;
      goto LAB_00162168;
    }
LAB_00161bb4:
    tmpurl.scheme = (*Curl_cstrdup)(pcVar21);
    bVar3 = true;
    if (tmpurl.scheme == (char *)0x0) goto LAB_00162164;
    goto LAB_00161bd0;
  }
  CVar5 = CURLUE_BAD_FILE_URL;
  if (urllen < 7) goto LAB_00162168;
  tmpurl.scheme = (*Curl_cstrdup)("file");
  if (tmpurl.scheme == (char *)0x0) {
    CVar5 = CURLUE_OUT_OF_MEMORY;
    goto LAB_00162168;
  }
  local_140 = (byte *)(url + 5);
  pbVar22 = (byte *)(urllen - 5);
  if ((*local_140 == 0x2f) && (url[6] == '/')) {
    local_140 = (byte *)(url + 7);
    if ((url[7] != 0x2f) &&
       (((0x19 < (byte)((url[7] & 0xdfU) + 0xbf) || ((url[8] != '|' && (url[8] != ':')))) ||
        ((cVar1 = url[9], cVar1 != '\0' && ((cVar1 != '/' && (cVar1 != '\\')))))))) {
      iVar6 = curl_strnequal((char *)local_140,"localhost/",10);
      if ((iVar6 == 0) && (iVar6 = curl_strnequal((char *)local_140,"127.0.0.1/",10), iVar6 == 0))
      goto LAB_00162168;
      local_140 = (byte *)(url + 0x10);
    }
    pbVar22 = (byte *)(url + (urllen - (long)local_140));
  }
  Curl_dyn_reset(&host);
  if (*local_140 == 0x2f) {
    if (((byte)((local_140[1] & 0xdf) + 0xbf) < 0x1a) &&
       ((local_140[2] == 0x7c || (local_140[2] == 0x3a)))) {
      bVar2 = local_140[3];
LAB_00161ca4:
      if (((bVar2 == 0) || (bVar2 == 0x2f)) || (bVar2 == 0x5c)) goto LAB_00162168;
    }
  }
  else if (((byte)((*local_140 & 0xdf) + 0xbf) < 0x1a) &&
          ((local_140[1] == 0x7c || (local_140[1] == 0x3a)))) {
    bVar2 = local_140[2];
    goto LAB_00161ca4;
  }
LAB_00161dbe:
  pbVar12 = (byte *)strchr((char *)local_140,0x23);
  if (pbVar12 != (byte *)0x0) {
    pbVar20 = pbVar12 + -(long)local_140;
    uVar23 = (long)pbVar22 - (long)pbVar20;
    tmpurl._80_8_ = tmpurl._80_8_ | 0x20000;
    pbVar22 = pbVar20;
    if (1 < uVar23) {
      if (cVar17 < '\0') {
        Curl_dyn_init(&enc,8000000);
        CVar5 = urlencode_str(&enc,(char *)(pbVar12 + 1),uVar23 - 1,true,false);
        if (CVar5 != CURLUE_OK) goto LAB_00162168;
        tmpurl.fragment = Curl_dyn_ptr(&enc);
      }
      else {
        tmpurl.fragment = (char *)Curl_memdup0((char *)(pbVar12 + 1),uVar23 - 1);
        if (tmpurl.fragment == (char *)0x0) goto LAB_00162164;
      }
    }
  }
  pvVar13 = memchr(local_140,0x3f,(size_t)pbVar22);
  if (pvVar13 != (void *)0x0) {
    pbVar20 = local_140 + (long)pbVar22;
    if (pbVar12 != (byte *)0x0) {
      pbVar20 = pbVar12;
    }
    uVar23 = (long)pbVar20 - (long)pvVar13;
    pbVar22 = pbVar22 + -uVar23;
    tmpurl._80_8_ = tmpurl._80_8_ | 0x10000;
    if (uVar23 < 2) {
      tmpurl.query = (*Curl_cstrdup)("");
    }
    else {
      if (cVar17 < '\0') {
        Curl_dyn_init(&enc,8000000);
        CVar5 = urlencode_str(&enc,(char *)((long)pvVar13 + 1),uVar23 - 1,true,true);
        if (CVar5 != CURLUE_OK) goto LAB_00162168;
        tmpurl.query = Curl_dyn_ptr(&enc);
        goto LAB_00161e8b;
      }
      tmpurl.query = (char *)Curl_memdup0((char *)((long)pvVar13 + 1),uVar23 - 1);
    }
    if (tmpurl.query == (char *)0x0) goto LAB_00162164;
  }
LAB_00161e8b:
  if (pbVar22 == (byte *)0x0) goto LAB_00162237;
  if (cVar17 < '\0') {
    Curl_dyn_init(&enc,8000000);
    CVar5 = urlencode_str(&enc,(char *)local_140,(size_t)pbVar22,true,false);
    if (CVar5 != CURLUE_OK) goto LAB_00162168;
    pbVar22 = (byte *)Curl_dyn_len(&enc);
    local_140 = (byte *)Curl_dyn_ptr(&enc);
    tmpurl.path = (char *)local_140;
  }
  CVar5 = CURLUE_OUT_OF_MEMORY;
  if (pbVar22 < (byte *)0x2) goto LAB_00162237;
  if (tmpurl.path == (char *)0x0) {
    local_140 = (byte *)Curl_memdup0((char *)local_140,(size_t)pbVar22);
    tmpurl.path = (char *)local_140;
    if (local_140 == (byte *)0x0) goto LAB_00162168;
  }
  else if (cVar17 < '\0') {
    tmpurl.path[(long)pbVar22] = '\0';
  }
  if ((flags & 0x10) != 0) goto LAB_00162237;
  local_120 = local_140;
  local_110 = pbVar22;
  Curl_dyn_init(&enc,(size_t)(pbVar22 + 1));
  _Var4 = is_dot((char **)&local_120,(size_t *)&local_110);
  pbVar12 = local_110;
  pbVar22 = local_120;
  if (!_Var4) goto LAB_0016205e;
  p = (char *)local_120;
  blen = (size_t)local_110;
  if (local_110 != (byte *)0x0) {
    if (*local_120 == 0x2f) {
      pbVar22 = local_120 + 1;
      pbVar12 = local_110 + -1;
      local_120 = pbVar22;
      local_110 = pbVar12;
LAB_0016205e:
      CVar9 = CURLE_OK;
      do {
        while( true ) {
          if ((pbVar12 == (byte *)0x0) || (CVar9 != CURLE_OK)) goto LAB_00162160;
          if (*pbVar22 == 0x2f) break;
LAB_001620c6:
          pbVar12 = pbVar12 + -1;
          CVar9 = Curl_dyn_addn(&enc,pbVar22,1);
          pbVar22 = pbVar22 + 1;
        }
        p = (char *)(pbVar22 + 1);
        blen = (size_t)(pbVar12 + -1);
        _Var4 = is_dot(&p,&blen);
        if (!_Var4) goto LAB_001620c6;
        if (blen == 0) goto LAB_0016214c;
        pbVar18 = (byte *)p;
        pbVar20 = (byte *)blen;
        if (*p != '/') {
          _Var4 = is_dot(&p,&blen);
          pbVar18 = (byte *)p;
          pbVar20 = (byte *)blen;
          if ((!_Var4) || (*p != '/' && blen != 0)) goto LAB_001620c6;
          sVar10 = Curl_dyn_len(&enc);
          if (sVar10 != 0) {
            pcVar14 = Curl_dyn_ptr(&enc);
            pvVar13 = memrchr(pcVar14,0x2f,sVar10);
            if (pvVar13 != (void *)0x0) {
              Curl_dyn_setlen(&enc,(long)pvVar13 - (long)pcVar14);
            }
          }
          if (pbVar20 == (byte *)0x0) goto LAB_0016214c;
        }
        CVar9 = CURLE_OK;
        pbVar22 = pbVar18;
        pbVar12 = pbVar20;
      } while( true );
    }
    _Var4 = is_dot(&p,&blen);
    if (!_Var4) goto LAB_0016205e;
    if (blen != 0) {
      if (*p == '/') {
        pbVar22 = (byte *)(p + 1);
        pbVar12 = (byte *)(blen - 1);
        local_120 = pbVar22;
        local_110 = pbVar12;
      }
      goto LAB_0016205e;
    }
  }
  goto LAB_001621de;
LAB_0016214c:
  CVar9 = Curl_dyn_addn(&enc,"/",1);
LAB_00162160:
  if (CVar9 != CURLE_OK) goto LAB_00162164;
LAB_001621de:
  sVar10 = Curl_dyn_len(&enc);
  CVar5 = CURLUE_OUT_OF_MEMORY;
  if (sVar10 == 0) {
    pcVar14 = (*Curl_cstrdup)("");
    if (pcVar14 == (char *)0x0) {
LAB_00162168:
      Curl_dyn_free(&host);
      free_urlhandle(&tmpurl);
      return CVar5;
    }
  }
  else {
    pcVar14 = Curl_dyn_ptr(&enc);
    if (pcVar14 == (char *)0x0) goto LAB_00162237;
  }
  (*Curl_cfree)(tmpurl.path);
  tmpurl.path = pcVar14;
LAB_00162237:
  tmpurl.host = Curl_dyn_ptr(&host);
  free_urlhandle(u);
  pCVar19 = &tmpurl;
  for (lVar15 = 0xb; lVar15 != 0; lVar15 = lVar15 + -1) {
    u->scheme = pCVar19->scheme;
    pCVar19 = (CURLU *)((long)pCVar19 + (ulong)bVar24 * -0x10 + 8);
    u = (Curl_URL *)((long)u + (ulong)bVar24 * -0x10 + 8);
  }
  return CURLUE_OK;
}

Assistant:

static CURLUcode parseurl_and_replace(const char *url, CURLU *u,
                                      unsigned int flags)
{
  CURLUcode result;
  CURLU tmpurl;
  memset(&tmpurl, 0, sizeof(tmpurl));
  result = parseurl(url, &tmpurl, flags);
  if(!result) {
    free_urlhandle(u);
    *u = tmpurl;
  }
  return result;
}